

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  TValue *pTVar6;
  TRef TVar7;
  SnapEntry SVar8;
  uint uVar9;
  TValue *pTVar10;
  TValue *pTVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  SnapShot *local_68;
  
  uVar1 = (J->cur).nsnap;
  uVar16 = (ulong)uVar1;
  uVar3 = (J->cur).nsnapmap;
  uVar12 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar16 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar12 != 1) {
      local_68 = (J->cur).snap;
      uVar16 = (ulong)(uVar12 - 1);
      uVar3 = local_68[uVar16].mapofs;
      goto LAB_001295e4;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar12) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
  local_68 = (J->cur).snap;
LAB_001295e4:
  iVar14 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  uVar15 = J->maxslot + J->baseslot;
  uVar12 = uVar3 + uVar15 + 2;
  if (J->sizesnapmap < uVar12) {
    lj_snap_grow_map_(J,uVar12);
  }
  local_68 = local_68 + uVar16;
  pSVar4 = (J->cur).snapmap;
  uVar1 = J->chain[0xb];
  uVar12 = 0;
  for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
    uVar17 = J->slot[uVar16];
    if (uVar16 == 1) {
      SVar8 = 0x1057fff;
      if ((uVar17 >> 0x10 & 1) != 0) goto LAB_00129761;
    }
    else {
      uVar9 = uVar17 & 0xffff;
      if (uVar9 == 0 && (uVar17 & 0x30000) != 0) {
        TVar7 = lj_ir_k64(J,IR_KNUM,J->L->base[uVar16 - J->baseslot].u64);
        uVar17 = uVar17 & 0xff0000 | TVar7;
        J->slot[uVar16] = uVar17;
        uVar9 = TVar7 & 0xffff;
      }
      if (uVar9 != 0) {
        SVar8 = iVar14 + (uVar17 & 0x13ffff);
        pIVar5 = (J->cur).ir;
        uVar13 = (ulong)uVar9;
        if (((*(char *)((long)pIVar5 + uVar13 * 8 + 5) == 'G') &&
            (uVar16 == pIVar5[uVar13].field_0.op1)) && (uVar1 < uVar9)) {
          uVar2 = *(ushort *)((long)pIVar5 + uVar13 * 8 + 2);
          if (((uVar2 & 0x20) == 0) &&
             (((uVar16 == 0 || ((ulong)uVar15 - 1 == uVar16)) ||
              ((*(byte *)((long)J->slot + uVar16 * 4 + 6) & 3) == 0)))) goto LAB_00129768;
          if ((uVar2 & 0x11) != 1) {
            SVar8 = iVar14 + 0x40000 + (uVar17 & 0x13ffff);
          }
        }
LAB_00129761:
        pSVar4[(ulong)uVar3 + (ulong)uVar12] = SVar8;
        uVar12 = uVar12 + 1;
      }
    }
LAB_00129768:
    iVar14 = iVar14 + 0x1000000;
  }
  local_68->nent = (uint8_t)uVar12;
  pTVar6 = J->L->base;
  pTVar10 = pTVar6 + -1;
  uVar17 = J->baseslot;
  if (*(char *)((pTVar6[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
    pTVar11 = pTVar10 + *(byte *)(*(long *)((pTVar6[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  else {
    pTVar11 = J->L->top;
  }
  *(ulong *)(pSVar4 + (ulong)uVar3 + (ulong)uVar12) = (ulong)(uVar17 - 2) | (long)J->pc << 8;
LAB_001297e4:
  if (pTVar10 <= pTVar6 + (1 - (ulong)uVar17)) {
    local_68->topslot = (uint8_t)((uint)((int)pTVar11 - (int)(pTVar6 + (1 - (ulong)uVar17))) >> 3);
    local_68->mapofs = uVar3;
    local_68->ref = (IRRef1)(J->cur).nins;
    local_68->mcofs = 0;
    local_68->nslots = (uint8_t)uVar15;
    local_68->count = '\0';
    (J->cur).nsnapmap = uVar12 + uVar3 + 2;
    return;
  }
  uVar16 = pTVar10->u64;
  if ((uVar16 & 3) != 0) goto code_r0x001297f2;
  pTVar10 = pTVar10 + (-2 - (ulong)*(byte *)(uVar16 - 3));
  goto LAB_00129816;
code_r0x001297f2:
  pTVar10 = (TValue *)((long)pTVar10 - (uVar16 & 0xfffffffffffffff8));
  if (((uint)uVar16 & 7) == 2) {
LAB_00129816:
    if (pTVar11 < pTVar10 + *(byte *)(*(long *)((pTVar10[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d))
    {
      pTVar11 = pTVar10 + *(byte *)(*(long *)((pTVar10[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
    }
  }
  goto LAB_001297e4;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}